

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

uint rlGetShaderBufferSize(uint id)

{
  return 0;
}

Assistant:

unsigned int rlGetShaderBufferSize(unsigned int id)
{
#if defined(GRAPHICS_API_OPENGL_43)
    GLint64 size = 0;
    glBindBuffer(GL_SHADER_STORAGE_BUFFER, id);
    glGetBufferParameteri64v(GL_SHADER_STORAGE_BUFFER, GL_BUFFER_SIZE, &size);
    return (size > 0)? (unsigned int)size : 0;
#else
    return 0;
#endif
}